

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CheckTxOutBuffer_Test::Transaction_CheckTxOutBuffer_Test
          (Transaction_CheckTxOutBuffer_Test *this)

{
  Transaction_CheckTxOutBuffer_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Transaction_CheckTxOutBuffer_Test_009df350;
  return;
}

Assistant:

TEST(Transaction, CheckTxOutBuffer) {
  Transaction tx(
      "0200000000010000000000000000220020c5ae4ff17cec055e964b573601328f3f879fa441e53ef88acdfd4d8e8df429ef00000000");

  EXPECT_EQ(tx.GetVersion(), exp_version);
  EXPECT_EQ(tx.GetLockTime(), exp_locktime);
  EXPECT_STREQ(
      Txid(tx.GetHash()).GetHex().c_str(),
      "fe6845196483dc83b7de6150ffd050d17d21914c1ad2f14639ac04bbe78c3ac1");
  EXPECT_STREQ(
      tx.GetTxid().GetHex().c_str(),
      "fe6845196483dc83b7de6150ffd050d17d21914c1ad2f14639ac04bbe78c3ac1");
  EXPECT_EQ(tx.GetTotalSize(), 53);
  EXPECT_EQ(tx.GetVsize(), 53);
  EXPECT_EQ(tx.GetWeight(), 212);
  EXPECT_EQ(tx.GetTxInCount(), 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
}